

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O2

void install_signal(int sig)

{
  int iVar1;
  sigaction sigact;
  
  memcpy(&sigact,&PTR_sighandler_00107d40,0x98);
  sigfillset((sigset_t *)&sigact.sa_mask);
  iVar1 = sigaction(sig,(sigaction *)&sigact,(sigaction *)0x0);
  if (-1 < iVar1) {
    return;
  }
  err(1,"sigaction for signal %i",sig);
}

Assistant:

static void install_signal(int sig)
{
	int ret;
	struct sigaction sigact = {
		.sa_sigaction = sighandler,
		.sa_flags = SA_SIGINFO,
	};

	sigfillset(&sigact.sa_mask);
	ret = sigaction(sig, &sigact, NULL);
	if (ret < 0)
		err(1, "sigaction for signal %i", sig);
}